

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport.c
# Opt level: O0

_Bool IoTHubTransport_SignalEndWorkerThread
                (TRANSPORT_HANDLE transportHandle,IOTHUB_CLIENT_CORE_HANDLE clientHandle)

{
  TRANSPORT_HANDLE_DATA *transportData;
  _Bool okToJoin;
  IOTHUB_CLIENT_CORE_HANDLE clientHandle_local;
  TRANSPORT_HANDLE transportHandle_local;
  
  if ((transportHandle == (TRANSPORT_HANDLE)0x0) || (clientHandle == (IOTHUB_CLIENT_CORE_HANDLE)0x0)
     ) {
    transportData._7_1_ = false;
  }
  else {
    transportData._7_1_ = signal_end_worker_thread(transportHandle,clientHandle);
  }
  return transportData._7_1_;
}

Assistant:

bool IoTHubTransport_SignalEndWorkerThread(TRANSPORT_HANDLE transportHandle, IOTHUB_CLIENT_CORE_HANDLE clientHandle)
{
    bool okToJoin;
    if (!(transportHandle == NULL || clientHandle == NULL))
    {
        TRANSPORT_HANDLE_DATA * transportData = (TRANSPORT_HANDLE_DATA*)transportHandle;
        okToJoin = signal_end_worker_thread(transportData, clientHandle);
    }
    else
    {
        okToJoin = false;
    }
    return okToJoin;
}